

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uncertain_measurements.cpp
# Opt level: O0

void __thiscall
uncertainOps_chemExample1_Test::~uncertainOps_chemExample1_Test
          (uncertainOps_chemExample1_Test *this)

{
  uncertainOps_chemExample1_Test *this_local;
  
  ~uncertainOps_chemExample1_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(uncertainOps, chemExample1)
{
    uncertain_measurement conc(13.7, 0.3, mol / L);
    uncertain_measurement path(1.0, 0.1, cm);
    uncertain_measurement absorb(0.172807, 0.000008, one);

    auto eps = absorb / (conc * path);
    EXPECT_NEAR(eps.value(), 0.013, 0.005);
    EXPECT_NEAR(eps.uncertainty(), 0.001, 0.0005);
}